

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

void __thiscall HModel::check_load_fromArrays(HModel *this)

{
  reference pvVar1;
  reference XAindex_00;
  reference XAvalue_00;
  reference XcolUpper_00;
  reference XcolLower_00;
  HModel *this_00;
  long in_RDI;
  vector<double,_std::allocator<double>_> XAvalue;
  vector<int,_std::allocator<int>_> XAindex;
  vector<int,_std::allocator<int>_> XAstart;
  vector<double,_std::allocator<double>_> XrowUpper;
  vector<double,_std::allocator<double>_> XrowLower;
  vector<double,_std::allocator<double>_> XcolUpper;
  vector<double,_std::allocator<double>_> XcolLower;
  vector<double,_std::allocator<double>_> XcolCost;
  int XobjSense;
  int XnumNz;
  int XnumRow;
  int XnumCol;
  HModel *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  value_type vVar2;
  undefined4 in_stack_fffffffffffffdc4;
  int in_stack_fffffffffffffde0;
  double *XrowLower_00;
  int in_stack_fffffffffffffdf8;
  undefined4 uVar3;
  undefined4 uVar4;
  vector<double,_std::allocator<double>_> local_100;
  vector<int,_std::allocator<int>_> local_e8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  vector<double,_std::allocator<double>_> local_a0;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  undefined4 local_40;
  value_type local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_34 = *(undefined4 *)(in_RDI + 0x60c);
  local_38 = *(undefined4 *)(in_RDI + 0x610);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),
                      (long)*(int *)(in_RDI + 0x60c));
  local_3c = *pvVar1;
  local_40 = *(undefined4 *)(in_RDI + 0x61c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x18053d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x18054a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x180557);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x180564);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x180571);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x18057e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x18058b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x180598);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x690),0);
  std::vector<double,std::allocator<double>>::assign<double*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(double *)in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a8),0);
  std::vector<double,std::allocator<double>>::assign<double*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(double *)in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6c0),0);
  std::vector<double,std::allocator<double>>::assign<double*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(double *)in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f0),0);
  std::vector<double,std::allocator<double>>::assign<double*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(double *)in_stack_fffffffffffffdb0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x708),0);
  std::vector<double,std::allocator<double>>::assign<double*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(double *)in_stack_fffffffffffffdb0);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),0);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x648),0);
  std::vector<int,std::allocator<int>>::assign<int*,void>
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (int *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0->intOption);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),0);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x660),0);
  std::vector<int,std::allocator<int>>::assign<int*,void>
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
             (int *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0->intOption);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),0);
  std::vector<double,_std::allocator<double>_>::operator[]
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x678),0);
  std::vector<double,std::allocator<double>>::assign<double*,void>
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
             ,(double *)in_stack_fffffffffffffdb0);
  clearModel(in_stack_fffffffffffffdb0);
  XrowLower_00 = (double *)0x0;
  uVar3 = local_34;
  uVar4 = local_40;
  XAindex_00 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
  XAvalue_00 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_70,(size_type)XrowLower_00);
  std::vector<double,_std::allocator<double>_>::operator[](&local_88,(size_type)XrowLower_00);
  XcolUpper_00 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_a0,(size_type)XrowLower_00);
  XcolLower_00 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_b8,(size_type)XrowLower_00);
  vVar2 = local_3c;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(size_type)XrowLower_00);
  this_00 = (HModel *)
            std::vector<int,_std::allocator<int>_>::operator[](&local_e8,(size_type)XrowLower_00);
  std::vector<double,_std::allocator<double>_>::operator[](&local_100,(size_type)XrowLower_00);
  load_fromArrays(this_00,(int)((ulong)pvVar1 >> 0x20),(int)pvVar1,
                  (double *)CONCAT44(in_stack_fffffffffffffdc4,vVar2),XcolLower_00,XcolUpper_00,
                  in_stack_fffffffffffffde0,XrowLower_00,XcolUpper_00,in_stack_fffffffffffffdf8,
                  (int *)CONCAT44(uVar4,uVar3),(int *)XAindex_00,XAvalue_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdc4,vVar2));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffdc4,vVar2));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_stack_fffffffffffffdc4,vVar2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdc4,vVar2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdc4,vVar2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdc4,vVar2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdc4,vVar2));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_fffffffffffffdc4,vVar2));
  return;
}

Assistant:

void HModel::check_load_fromArrays() {
  // Use the arrays read from an MPS file to test the routine to
  // read a model passed by arrays. First copy the data.
  int XnumCol = numCol;
  int XnumRow = numRow;
  int XnumNz = Astart[numCol];
  int XobjSense = objSense;
  vector<double> XcolCost;
  vector<double> XcolLower;
  vector<double> XcolUpper;
  vector<double> XrowLower;
  vector<double> XrowUpper;
  vector<int> XAstart;
  vector<int> XAindex;
  vector<double> XAvalue;
  
  XcolCost.assign(&colCost[0], &colCost[0] + XnumCol);
  XcolLower.assign(&colLower[0], &colLower[0] + XnumCol);
  XcolUpper.assign(&colUpper[0], &colUpper[0] + XnumCol);
  XrowLower.assign(&rowLower[0], &rowLower[0] + XnumRow);
  XrowUpper.assign(&rowUpper[0], &rowUpper[0] + XnumRow);
  XAstart.assign(&Astart[0], &Astart[0] + XnumCol + 1);
  XAindex.assign(&Aindex[0], &Aindex[0] + XnumNz);
  XAvalue.assign(&Avalue[0], &Avalue[0] + XnumNz);
  
  clearModel();
  load_fromArrays(XnumCol, XobjSense, &XcolCost[0], &XcolLower[0], &XcolUpper[0],
		  XnumRow, &XrowLower[0], &XrowUpper[0],
		  XnumNz, &XAstart[0], &XAindex[0], &XAvalue[0]);
}